

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_string_parser.c
# Opt level: O0

int connectionstringparser_splitHostName_from_char
              (char *hostName,STRING_HANDLE nameString,STRING_HANDLE suffixString)

{
  int iVar1;
  char *local_30;
  char *runHostName;
  int result;
  STRING_HANDLE suffixString_local;
  STRING_HANDLE nameString_local;
  char *hostName_local;
  
  if ((((hostName == (char *)0x0) || (*hostName == '\0')) || (*hostName == '.')) ||
     ((nameString == (STRING_HANDLE)0x0 || (local_30 = hostName, suffixString == (STRING_HANDLE)0x0)
      ))) {
    runHostName._4_4_ = 0xab;
  }
  else {
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (*local_30 == '.') {
        local_30 = local_30 + 1;
        break;
      }
    }
    if (*local_30 == '\0') {
      runHostName._4_4_ = 0xbe;
    }
    else {
      iVar1 = STRING_copy_n(nameString,hostName,(size_t)(local_30 + (-1 - (long)hostName)));
      if (iVar1 == 0) {
        iVar1 = STRING_copy(suffixString,local_30);
        if (iVar1 == 0) {
          runHostName._4_4_ = 0;
        }
        else {
          runHostName._4_4_ = 0xcc;
        }
      }
      else {
        runHostName._4_4_ = 0xc6;
      }
    }
  }
  return runHostName._4_4_;
}

Assistant:

int connectionstringparser_splitHostName_from_char(const char* hostName, STRING_HANDLE nameString, STRING_HANDLE suffixString)
{
    int result;
    const char* runHostName = hostName;

    if ((hostName == NULL) || ((*hostName) == '\0') || ((*hostName) == '.') || (nameString == NULL) || (suffixString == NULL))
    {
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_026: [If the hostName is NULL, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_027: [If the hostName is an empty string, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_028: [If the nameString is NULL, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_029: [If the suffixString is NULL, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
        /* Codes_SRS_CONNECTIONSTRINGPARSER_21_030: [If the hostName is not a valid host name, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
        result = MU_FAILURE;
    }
    else
    {
        while ((*runHostName) != '\0')
        {
            if ((*runHostName) == '.')
            {
                /* Codes_SRS_CONNECTIONSTRINGPARSER_21_023: [connectionstringparser_splitHostName_from_char shall copy all characters, from the beginning of the hostName to the first . to the nameString.]*/
                /* Codes_SRS_CONNECTIONSTRINGPARSER_21_024: [connectionstringparser_splitHostName_from_char shall copy all characters, from the first . to the end of the hostName, to the suffixString.]*/
                runHostName++;
                break;
            }
            runHostName++;
        }

        if ((*runHostName) == '\0')
        {
            /* Codes_SRS_CONNECTIONSTRINGPARSER_21_030: [If the hostName is not a valid host name, connectionstringparser_splitHostName_from_char shall return MU_FAILURE.]*/
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_CONNECTIONSTRINGPARSER_21_023: [connectionstringparser_splitHostName_from_char shall copy all characters, from the beginning of the hostName to the first . to the nameString.]*/
            if (STRING_copy_n(nameString, hostName, runHostName - hostName - 1) != 0)
            {
                /* Codes_SRS_CONNECTIONSTRINGPARSER_21_031: [If connectionstringparser_splitHostName_from_char get error copying the name to the nameString, it shall return MU_FAILURE.]*/
                result = MU_FAILURE;
            }
            /* Codes_SRS_CONNECTIONSTRINGPARSER_21_024: [connectionstringparser_splitHostName_from_char shall copy all characters, from the first . to the end of the hostName, to the suffixString.]*/
            else if (STRING_copy(suffixString, runHostName) != 0)
            {
                /* Codes_SRS_CONNECTIONSTRINGPARSER_21_032: [If connectionstringparser_splitHostName_from_char get error copying the suffix to the suffixString, it shall return MU_FAILURE.]*/
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_CONNECTIONSTRINGPARSER_21_025: [If connectionstringparser_splitHostName_from_char get success splitting the hostName, it shall return 0.]*/
                result = 0;
            }
        }
    }

    return result;
}